

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::IsPartOf_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,IsPartOf_PDU *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Transfer Control Request PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1e0,&this->super_Simulation_Management_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  DATA_TYPE::RelationshipRecord::GetAsString_abi_cxx11_(&local_200,&this->m_RelRec);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"Location Of Part: ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_220,&this->m_LocPrt);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  DATA_TYPE::NamedLocationIdentifier::GetAsString_abi_cxx11_(&local_240,&this->m_NmLocID);
  poVar1 = std::operator<<(poVar1,(string *)&local_240);
  poVar1 = std::operator<<(poVar1,"Part Type: ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_260,&this->m_PrtTyp);
  std::operator<<(poVar1,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IsPartOf_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Transfer Control Request PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << m_RelRec.GetAsString()
       << "Location Of Part: " << m_LocPrt.GetAsString()
       << m_NmLocID.GetAsString()
       << "Part Type: " << m_PrtTyp.GetAsString();

    return ss.str();
}